

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O2

el_status_t move_to_char(void)

{
  int iVar1;
  el_status_t eVar2;
  long lVar3;
  
  iVar1 = tty_get();
  if (iVar1 == -1) {
    eVar2 = CSeof;
  }
  else {
    eVar2 = CSstay;
    for (lVar3 = (long)(rl_point + 1); (int)lVar3 < rl_end; lVar3 = lVar3 + 1) {
      if (iVar1 == rl_line_buffer[lVar3]) {
        rl_point = (int)lVar3;
        return CSmove;
      }
    }
  }
  return eVar2;
}

Assistant:

static el_status_t move_to_char(void)
{
    int i, c;
    char *p;

    if ((c = tty_get()) == EOF)
        return CSeof;

    for (i = rl_point + 1, p = &rl_line_buffer[i]; i < rl_end; i++, p++) {
        if (*p == c) {
            rl_point = i;
            return CSmove;
        }
    }

    return CSstay;
}